

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O2

void __thiscall iDynTree::LinkPositions::~LinkPositions(LinkPositions *this)

{
  resize(this,0);
  std::_Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::~_Vector_base
            ((_Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)this);
  return;
}

Assistant:

LinkPositions::~LinkPositions()
{
    resize(0);
}